

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_object.cpp
# Opt level: O3

global_object_create_result *
mjs::make_error_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  size_t sVar1;
  gc_heap_ptr_untyped *pgVar2;
  global_object_create_result *p_00;
  int iVar3;
  long *plVar4;
  void *pvVar5;
  char *pcVar6;
  function_object *pfVar7;
  long *plVar8;
  int *piVar9;
  long lVar10;
  gc_heap_ptr<mjs::gc_function> p;
  object_ptr prototype;
  native_error_type error_type;
  string n;
  gc_heap_ptr<mjs::function_object> constructor;
  object_ptr error_prototype;
  gc_heap_ptr<mjs::function_object> error_constructor;
  string err_str;
  undefined1 local_120 [24];
  char *local_108;
  gc_heap_ptr_untyped local_100;
  gc_heap_ptr_untyped *local_f0;
  undefined1 local_e4 [4];
  undefined1 local_e0 [24];
  gc_heap_ptr_untyped local_c8;
  gc_heap_ptr_untyped local_b8;
  string_view local_a8;
  gc_heap_ptr_untyped local_98;
  gc_heap_ptr_untyped local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [8];
  char *local_60;
  gc_heap_ptr_untyped local_58;
  global_object_create_result *local_48;
  gc_heap_ptr_untyped local_40;
  
  local_48 = __return_storage_ptr__;
  plVar4 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar4 + 0x98))(&local_40,plVar4,"Error");
  pvVar5 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  sVar1 = *(size_t *)((long)pvVar5 + 8);
  local_100.heap_ = (gc_heap *)((ulong)local_100.heap_._4_4_ << 0x20);
  plVar4 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar4 + 0x58))(local_120,plVar4);
  pvVar5 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  local_a8._M_len = 0;
  local_a8._M_str = "";
  string::string((string *)(local_120 + 0x10),*(gc_heap **)((long)pvVar5 + 8),&local_a8);
  gc_heap::
  allocate_and_construct<mjs::error_object,mjs::native_error_type,mjs::string&,mjs::gc_heap_ptr<mjs::object>,mjs::string>
            ((gc_heap *)local_e0,sVar1,(native_error_type *)0x38,(string *)&local_100,
             (gc_heap_ptr<mjs::object> *)&local_40,(string *)local_120);
  local_88.heap_ = (gc_heap *)CONCAT44(local_e0._4_4_,local_e0._0_4_);
  local_88.pos_ = local_e0._8_4_;
  local_f0 = &global->super_gc_heap_ptr_untyped;
  if (local_88.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_88.heap_,&local_88);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_e0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
  local_58.heap_ = (gc_heap *)0x0;
  local_58.pos_ = 0;
  lVar10 = 0;
  do {
    local_e4 = *(undefined1 (*) [4])((long)&native_error_types + lVar10);
    plVar4 = (long *)gc_heap_ptr_untyped::get(local_f0);
    pcVar6 = type_string((native_error_type)local_e4);
    (**(code **)(*plVar4 + 0x98))(&local_a8,plVar4,pcVar6);
    pgVar2 = local_f0;
    if (local_e4 == (undefined1  [4])0x0) {
      local_100.heap_ = local_88.heap_;
      local_100.pos_ = local_88.pos_;
      if (local_88.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_88.heap_,&local_100);
      }
    }
    else {
      pvVar5 = gc_heap_ptr_untyped::get(local_f0);
      sVar1 = *(size_t *)((long)pvVar5 + 8);
      pvVar5 = gc_heap_ptr_untyped::get(pgVar2);
      local_120._16_8_ = (slot *)0x0;
      local_108 = "";
      string::string((string *)local_120,*(gc_heap **)((long)pvVar5 + 8),
                     (string_view *)(local_120 + 0x10));
      gc_heap::
      allocate_and_construct<mjs::error_object,mjs::native_error_type_const&,mjs::string&,mjs::gc_heap_ptr<mjs::object>&,mjs::string>
                ((gc_heap *)local_e0,sVar1,(native_error_type *)0x38,(string *)local_e4,
                 (gc_heap_ptr<mjs::object> *)&local_a8,(string *)&local_88);
      local_100.heap_ = (gc_heap *)CONCAT44(local_e0._4_4_,local_e0._0_4_);
      local_100.pos_ = local_e0._8_4_;
      if (local_100.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_100.heap_,&local_100);
      }
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_e0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
    }
    local_e0._0_4_ = local_e4;
    local_e0._8_8_ = local_a8._M_len;
    local_e0._16_4_ = (uint32_t)local_a8._M_str;
    if ((gc_heap *)local_a8._M_len != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_a8._M_len,(gc_heap_ptr_untyped *)(local_e0 + 8));
    }
    local_c8.heap_ = local_100.heap_;
    local_c8.pos_ = local_100.pos_;
    if (local_100.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_100.heap_,&local_c8);
    }
    local_b8.heap_ = local_f0->heap_;
    local_b8.pos_ = local_f0->pos_;
    if (local_b8.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_b8.heap_,&local_b8);
    }
    gc_heap_ptr_untyped::get(&local_100);
    object::class_name((object *)local_78);
    make_raw_function((mjs *)&local_98,(gc_heap_ptr<mjs::global_object> *)local_f0);
    pfVar7 = (function_object *)gc_heap_ptr_untyped::get(&local_98);
    local_120._16_8_ = (slot *)0x0;
    local_108 = (char *)((ulong)local_108 & 0xffffffff00000000);
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_120,(size_t)(pfVar7->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_120);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d89d0;
    *(undefined4 *)((long)pvVar5 + 0x10) = local_e0._0_4_;
    *(undefined8 *)((long)pvVar5 + 0x18) = local_e0._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x20) = local_e0._16_4_;
    if ((gc_heap *)local_e0._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_e0._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    *(gc_heap **)((long)pvVar5 + 0x28) = local_c8.heap_;
    *(uint32_t *)((long)pvVar5 + 0x30) = local_c8.pos_;
    if (local_c8.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_c8.heap_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x28));
    }
    *(gc_heap **)((long)pvVar5 + 0x38) = local_b8.heap_;
    *(uint32_t *)((long)pvVar5 + 0x40) = local_b8.pos_;
    if (local_b8.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_b8.heap_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x38));
    }
    function_object::put_function
              (pfVar7,(gc_heap_ptr<mjs::gc_function> *)local_120,
               (gc_heap_ptr<mjs::gc_string> *)local_78,
               (gc_heap_ptr<mjs::gc_string> *)(local_120 + 0x10),1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_78);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_c8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_e0 + 8));
    pfVar7 = (function_object *)gc_heap_ptr_untyped::get(&local_98);
    function_object::default_construct_function(pfVar7);
    pfVar7 = (function_object *)gc_heap_ptr_untyped::get(&local_98);
    function_object::put_prototype_with_attributes
              (pfVar7,(object_ptr *)&local_100,dont_delete|dont_enum|read_only);
    plVar4 = (long *)gc_heap_ptr_untyped::get(&local_100);
    plVar8 = (long *)gc_heap_ptr_untyped::get(local_f0);
    (**(code **)(*plVar8 + 0x98))(local_120,plVar8,"constructor");
    local_120._16_8_ = local_98.heap_;
    local_108 = (char *)CONCAT44(local_108._4_4_,local_98.pos_);
    if ((slot *)local_98.heap_ == (slot *)0x0) {
      local_e0._0_4_ = object;
      local_e0._8_8_ = (slot *)0x0;
      local_e0._16_4_ = local_98.pos_;
    }
    else {
      gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)(local_120 + 0x10));
      local_e0._0_4_ = object;
      local_e0._8_8_ = local_120._16_8_;
      local_e0._16_4_ = (uint32_t)local_108;
      if ((slot *)local_120._16_8_ != (slot *)0x0) {
        gc_heap::attach((gc_heap *)local_120._16_8_,(gc_heap_ptr_untyped *)(local_e0 + 8));
      }
    }
    (**(code **)(*plVar4 + 0x28))(plVar4,local_120,(value *)local_e0,2);
    value::destroy((value *)local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 0x10));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
    plVar4 = (long *)gc_heap_ptr_untyped::get(&local_100);
    pvVar5 = gc_heap_ptr_untyped::get(local_f0);
    local_120._16_8_ = (slot *)0x7;
    local_108 = "message";
    string::string((string *)local_120,*(gc_heap **)((long)pvVar5 + 8),
                   (string_view *)(local_120 + 0x10));
    pvVar5 = gc_heap_ptr_untyped::get(local_f0);
    local_68 = (undefined1  [8])0x0;
    local_60 = "";
    string::string((string *)local_78,*(gc_heap **)((long)pvVar5 + 8),(string_view *)local_68);
    local_e0._0_4_ = string;
    local_e0._8_8_ = local_78._0_8_;
    local_e0._16_4_ = local_78._8_4_;
    if ((slot *)local_78._0_8_ != (slot *)0x0) {
      gc_heap::attach((gc_heap *)local_78._0_8_,(gc_heap_ptr_untyped *)(local_e0 + 8));
    }
    (**(code **)(*plVar4 + 8))(plVar4,local_120,(value *)local_e0,6);
    value::destroy((value *)local_e0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_78);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
    if (local_58.heap_ == (gc_heap *)0x0) {
      piVar9 = (int *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_a8);
      if (*piVar9 != 5) {
LAB_00138525:
        __assert_fail("n.view() == L\"Error\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/error_object.cpp"
                      ,0x7c,
                      "global_object_create_result mjs::make_error_object(const gc_heap_ptr<global_object> &)"
                     );
      }
      iVar3 = wmemcmp(piVar9 + 1,L"Error",5);
      if (iVar3 != 0) goto LAB_00138525;
      gc_heap_ptr_untyped::operator=(&local_58,&local_98);
    }
    else {
      plVar4 = (long *)gc_heap_ptr_untyped::get(local_f0);
      local_120._0_8_ = local_98.heap_;
      local_120._8_4_ = local_98.pos_;
      if ((slot *)local_98.heap_ == (slot *)0x0) {
        local_e0._0_4_ = object;
        local_e0._8_8_ = (slot *)0x0;
        local_e0._16_4_ = local_98.pos_;
      }
      else {
        gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)local_120);
        local_e0._0_4_ = object;
        local_e0._8_8_ = local_120._0_8_;
        local_e0._16_4_ = local_120._8_4_;
        if ((slot *)local_120._0_8_ != (slot *)0x0) {
          gc_heap::attach((gc_heap *)local_120._0_8_,(gc_heap_ptr_untyped *)(local_e0 + 8));
        }
      }
      (**(code **)(*plVar4 + 8))(plVar4,&local_a8,(value *)local_e0,2);
      value::destroy((value *)local_e0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a8);
    pgVar2 = local_f0;
    lVar10 = lVar10 + 4;
    if (lVar10 == 0x20) {
      local_68 = (undefined1  [8])local_f0->heap_;
      local_60 = (char *)CONCAT44(local_60._4_4_,local_f0->pos_);
      gc_heap::attach((gc_heap *)local_68,(gc_heap_ptr_untyped *)local_68);
      local_78._0_8_ = (gc_heap *)0x8;
      local_78._8_8_ = "toString";
      string::string((string *)&local_98,pgVar2->heap_,(string_view *)local_78);
      plVar4 = (long *)gc_heap_ptr_untyped::get(&local_88);
      make_raw_function((mjs *)&local_100,(gc_heap_ptr<mjs::global_object> *)pgVar2);
      pfVar7 = (function_object *)gc_heap_ptr_untyped::get(&local_100);
      local_120._16_8_ = (slot *)0x0;
      local_108 = (char *)((ulong)local_108 & 0xffffffff00000000);
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_120,(size_t)(pfVar7->super_native_object).super_object.heap_);
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_120);
      *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d8a10;
      *(undefined1 (*) [8])((long)pvVar5 + 0x10) = local_68;
      *(uint32_t *)((long)pvVar5 + 0x18) = local_60._0_4_;
      if (local_68 != (undefined1  [8])0x0) {
        gc_heap::attach((gc_heap *)local_68,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x10));
      }
      function_object::put_function
                (pfVar7,(gc_heap_ptr<mjs::gc_function> *)local_120,
                 (gc_heap_ptr<mjs::gc_string> *)&local_98,
                 (gc_heap_ptr<mjs::gc_string> *)(local_120 + 0x10),0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 0x10));
      local_a8._M_len = (size_t)local_100.heap_;
      local_a8._M_str = (char *)CONCAT44(local_a8._M_str._4_4_,local_100.pos_);
      if (local_100.heap_ == (gc_heap *)0x0) {
        local_e0._0_4_ = object;
        local_e0._8_8_ = (gc_heap *)0x0;
        local_e0._16_4_ = local_100.pos_;
      }
      else {
        gc_heap::attach(local_100.heap_,(gc_heap_ptr_untyped *)&local_a8);
        local_e0._0_4_ = object;
        local_e0._8_8_ = local_a8._M_len;
        local_e0._16_4_ = (uint32_t)local_a8._M_str;
        if ((gc_heap *)local_a8._M_len != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_a8._M_len,(gc_heap_ptr_untyped *)(local_e0 + 8));
        }
      }
      (**(code **)(*plVar4 + 8))(plVar4,&local_98,local_e0,2);
      value::destroy((value *)local_e0);
      p_00 = local_48;
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_100);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_68);
      (p_00->obj).super_gc_heap_ptr_untyped.heap_ = local_58.heap_;
      (p_00->obj).super_gc_heap_ptr_untyped.pos_ = local_58.pos_;
      if (local_58.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_58.heap_,(gc_heap_ptr_untyped *)p_00);
      }
      (p_00->prototype).super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x0;
      (p_00->prototype).super_gc_heap_ptr_untyped.pos_ = 0;
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_58);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_88);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
      return p_00;
    }
  } while( true );
}

Assistant:

global_object_create_result make_error_object(const gc_heap_ptr<global_object>& global) {
    auto err_str = global->common_string("Error");

    object_ptr error_prototype = global->heap().make<error_object>(native_error_type::generic, err_str, global->object_prototype(), string{global->heap(), ""});

    gc_heap_ptr<function_object> error_constructor;
    for (const auto error_type: native_error_types) {
        auto n = global->common_string(type_string(error_type));
        auto prototype = error_type == native_error_type::generic ? error_prototype : global->heap().make<error_object>(error_type, n, error_prototype, string{global->heap(), ""});
        auto constructor = make_function(global, [error_type, n, prototype, global](const value&, const std::vector<value>& args) {
            auto& h = global->heap();
            auto eo = h.make<error_object>(error_type, n, prototype, string{h, global->stack_trace()});
            if (!args.empty() && args.front().type() != value_type::undefined) {
                eo->put(global->common_string("message"), value{to_string(h, args.front())}, message_attributes);
            }
            return value{eo};
        }, prototype->class_name().unsafe_raw_get(), 1);
        constructor->default_construct_function();

        constructor->put_prototype_with_attributes(prototype, global_object::prototype_attributes);

        prototype->redefine_own_property(global->common_string("constructor"), value{constructor}, global_object::default_attributes);
        prototype->put(string{global->heap(), "message"}, value{string{global->heap(), ""}}, message_attributes);

        if (!error_constructor) {
            assert(n.view() == L"Error");
            error_constructor = constructor;
        } else {
            global->put(n, value{constructor}, property_attribute::dont_enum);
        }
    }

    put_native_function(global, error_prototype, "toString", [global](const value& this_, const std::vector<value>&) {
        if (this_.type() == value_type::object) {
            auto& o = this_.object_value();
            if (o.has_type<error_object>()) {
                return value{static_cast<const error_object&>(*o).to_string()};
            }
        }
        return value{global->common_string("Error")};
    }, 0);

    return { error_constructor, nullptr };
}